

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenuEx(char *label,char *icon,bool enabled)

{
  ImVec2 pos_00;
  ImVec2 pos_01;
  bool bVar1;
  byte in_DL;
  ImVec2 in_RSI;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  ImGuiLastItemData last_item_in_parent;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  float child_dir;
  float ref_unit;
  ImGuiWindow *child_menu_window;
  ImGuiPopupData *child_popup;
  bool moving_toward_child_menu;
  bool want_close;
  bool want_open;
  bool hovered;
  ImVec2 text_pos_1;
  float extra_w;
  float min_w;
  float checkmark_w;
  float icon_w;
  ImVec2 text_pos;
  float w;
  ImGuiSelectableFlags selectable_flags;
  bool pressed;
  ImGuiMenuColumns *offsets;
  ImVec2 pos;
  ImVec2 popup_pos;
  bool menuset_is_open;
  ImVec2 label_size;
  ImGuiWindowFlags window_flags;
  bool menu_is_open;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImRect *in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  undefined8 in_stack_fffffffffffffe08;
  ImGuiWindow *pIVar6;
  ImGuiPopupFlags popup_flags;
  ImGuiWindow *in_stack_fffffffffffffe10;
  int count;
  float in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined1 hide_text_after_double_hash;
  byte bVar7;
  ImGuiWindow *in_stack_fffffffffffffe20;
  ImVec2 *in_stack_fffffffffffffe28;
  ImGuiWindowFlags flags;
  ImGuiID id_00;
  undefined8 in_stack_fffffffffffffe30;
  ImVec2 *this;
  undefined4 in_stack_fffffffffffffe3c;
  undefined1 uVar8;
  char *in_stack_fffffffffffffe40;
  ImVec2 *this_00;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  float in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  float fVar9;
  ImVec2 local_190;
  undefined1 local_188 [60];
  float local_14c;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138 [2];
  ImVec2 size_arg;
  ImGuiSelectableFlags in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined1 selected;
  char *in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffefc;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ImGuiDir in_stack_ffffffffffffff00;
  ImU32 in_stack_ffffffffffffff04;
  ImVec2 in_stack_ffffffffffffff10;
  float local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_ac;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_94;
  ImVec2 local_8c;
  float local_84;
  ImVec2 local_80;
  ImVec2 local_78;
  float local_70;
  bool local_69;
  ImGuiMenuColumns *local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  bool local_4d;
  ImVec2 local_4c;
  undefined4 local_44;
  byte local_3d;
  float local_3c;
  ImVec2 local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  byte local_19;
  ImVec2 local_18;
  bool local_1;
  
  selected = (undefined1)((uint)in_stack_fffffffffffffee4 >> 0x18);
  uVar8 = (undefined1)((uint)in_stack_fffffffffffffe3c >> 0x18);
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = (ImVec2)&GImGui->Style;
    local_3c = (float)ImGuiWindow::GetID(in_stack_fffffffffffffe20,
                                         (char *)CONCAT44(in_stack_fffffffffffffe1c,
                                                          in_stack_fffffffffffffe18),
                                         (char *)in_stack_fffffffffffffe10);
    hide_text_after_double_hash = (undefined1)((uint)in_stack_fffffffffffffe1c >> 0x18);
    local_3d = IsPopupOpen((ImGuiID)in_stack_fffffffffffffe10,
                           (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    local_44 = 0x10080145;
    if ((local_28->Flags & 0x10000000U) != 0) {
      local_44 = 0x11080145;
    }
    bVar1 = ImVector<unsigned_int>::contains(&local_30->MenusIdSubmittedThisFrame,(uint *)&local_3c)
    ;
    if (bVar1) {
      if ((local_3d & 1) == 0) {
        ImGuiNextWindowData::ClearFlags(&local_30->NextWindowData);
      }
      else {
        local_3d = BeginPopupEx((ImGuiID)in_stack_fffffffffffffe30,
                                (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      }
      local_1 = (bool)(local_3d & 1);
    }
    else {
      ImVector<unsigned_int>::push_back
                ((ImVector<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (uint *)in_stack_fffffffffffffdf8);
      local_4c = CalcTextSize((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                              (bool)hide_text_after_double_hash,in_stack_fffffffffffffe18);
      local_4d = IsRootOfOpenMenuSet();
      if (local_4d) {
        PushItemFlag((ImGuiItemFlags)in_stack_fffffffffffffe04,
                     SUB41((uint)in_stack_fffffffffffffe00 >> 0x18,0));
      }
      ImVec2::ImVec2(&local_58);
      local_60 = (local_28->DC).CursorPos;
      PushID((char *)in_stack_fffffffffffffe10);
      if ((local_19 & 1) == 0) {
        BeginDisabled(SUB41((uint)in_stack_fffffffffffffe04 >> 0x18,0));
      }
      local_68 = &(local_28->DC).MenuColumns;
      local_70 = 4.102077e-29;
      if ((local_28->DC).LayoutType == 0) {
        fVar9 = 0.5;
        fVar5 = (local_60.x + -1.0) - (float)(int)(((ImVec2 *)((long)local_38 + 0x4c))->x * 0.5);
        fVar2 = local_60.y - *(float *)((long)local_38 + 0x40);
        fVar3 = ImGuiWindow::MenuBarHeight(in_stack_fffffffffffffe10);
        popup_flags = (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe08 >> 0x20);
        ImVec2::ImVec2(&local_78,fVar5,fVar2 + fVar3);
        local_58 = local_78;
        (local_28->DC).CursorPos.x =
             (local_28->DC).CursorPos.x +
             (float)(int)(((ImVec2 *)((long)local_38 + 0x4c))->x * fVar9);
        fVar3 = ((ImVec2 *)((long)local_38 + 0x4c))->x;
        ImVec2::ImVec2(&local_80,fVar3 + fVar3,*(float *)((long)local_38 + 0x50));
        PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                     in_stack_fffffffffffffe28);
        id_00 = (ImGuiID)in_stack_fffffffffffffe30;
        flags = (ImGuiWindowFlags)((ulong)in_stack_fffffffffffffe28 >> 0x20);
        local_84 = local_4c.x;
        ImVec2::ImVec2(&local_8c,(local_28->DC).CursorPos.x + (float)local_68->OffsetLabel,
                       (local_28->DC).CursorPos.y + (local_28->DC).CurrLineTextBaseOffset);
        ImVec2::ImVec2(&local_94,local_84,0.0);
        local_69 = Selectable(in_stack_fffffffffffffee8,(bool)selected,in_stack_fffffffffffffee0,
                              (ImVec2 *)size_arg);
        local_a0 = local_8c;
        pos_00.y = fVar9;
        pos_00.x = fVar5;
        RenderText(pos_00,(char *)CONCAT44(fVar2,in_stack_fffffffffffffe48),
                   in_stack_fffffffffffffe40,(bool)uVar8);
        PopStyleVar((int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
        (local_28->DC).CursorPos.x =
             (float)(int)(((ImVec2 *)((long)local_38 + 0x4c))->x * -0.5) +
             (local_28->DC).CursorPos.x;
      }
      else {
        ImVec2::ImVec2(&local_a8,local_60.x,local_60.y - *(float *)((long)local_38 + 0xc));
        id_00 = (ImGuiID)in_stack_fffffffffffffe30;
        local_58 = local_a8;
        if ((local_18 == (ImVec2)0x0) || (*(char *)local_18 == '\0')) {
          fVar3 = 0.0;
        }
        else {
          _local_b4 = CalcTextSize((char *)in_stack_fffffffffffffe28,
                                   (char *)in_stack_fffffffffffffe20,
                                   (bool)hide_text_after_double_hash,in_stack_fffffffffffffe18);
          fVar3 = local_b4;
        }
        local_b8 = (float)(int)(local_30->FontSize * 1.2);
        local_ac = fVar3;
        local_bc = ImGuiMenuColumns::DeclColumns
                             ((ImGuiMenuColumns *)in_stack_fffffffffffffe10,
                              (float)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                              (float)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                              in_stack_fffffffffffffe00);
        popup_flags = (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe08 >> 0x20);
        _local_c8 = GetContentRegionAvail();
        local_c0 = ImMax<float>(0.0,local_c8 - local_bc);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,
                       (local_28->DC).CursorPos.x + (float)local_68->OffsetLabel,
                       (local_28->DC).CursorPos.y + (local_28->DC).CurrLineTextBaseOffset);
        uVar8 = 0;
        this_00 = (ImVec2 *)&stack0xffffffffffffff28;
        ImVec2::ImVec2(this_00,local_bc,0.0);
        local_69 = Selectable(in_stack_fffffffffffffee8,(bool)selected,in_stack_fffffffffffffee0,
                              (ImVec2 *)size_arg);
        IVar4.y = in_stack_fffffffffffffe54;
        IVar4.x = in_stack_fffffffffffffe50;
        RenderText(IVar4,(char *)CONCAT44(in_stack_fffffffffffffe4c,fVar3),(char *)this_00,
                   (bool)uVar8);
        if (0.0 < local_ac) {
          this = (ImVec2 *)&stack0xffffffffffffff10;
          ImVec2::ImVec2(this,(float)local_68->OffsetIcon,0.0);
          id_00 = (ImGuiID)this;
          ::operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x508184);
          pos_01.y = in_stack_fffffffffffffe54;
          pos_01.x = in_stack_fffffffffffffe50;
          RenderText(pos_01,(char *)CONCAT44(in_stack_fffffffffffffe4c,fVar3),(char *)this_00,
                     (bool)uVar8);
        }
        flags = (ImGuiWindowFlags)((ulong)local_28->DrawList >> 0x20);
        in_stack_fffffffffffffe20 = (ImGuiWindow *)&stack0xffffffffffffff00;
        ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffe20,
                       local_30->FontSize * 0.3 + (float)local_68->OffsetMark + local_c0,0.0);
        IVar4 = ::operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x508224);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                    SUB84(in_stack_fffffffffffffe10,0));
        RenderArrow((ImDrawList *)IVar4,in_stack_ffffffffffffff10,in_stack_ffffffffffffff04,
                    in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      }
      if ((local_19 & 1) == 0) {
        EndDisabled();
      }
      bVar7 = 0;
      if (((float)local_30->HoveredId == local_3c) && (bVar7 = 0, (local_19 & 1) != 0)) {
        bVar7 = local_30->NavDisableMouseHover ^ 0xff;
      }
      uVar10 = (bVar7 & 1) << 0x18;
      if ((local_4d & 1U) != 0) {
        PopItemFlag();
      }
      bVar7 = (byte)(uVar10 >> 0x18);
      uVar11 = (uint)bVar7 << 0x18;
      uVar12 = 0;
      if ((local_28->DC).LayoutType == 1) {
        if ((local_30->BeginPopupStack).Size < (local_30->OpenPopupStack).Size) {
          in_stack_fffffffffffffe10 =
               (ImGuiWindow *)
               ImVector<ImGuiPopupData>::operator[]
                         (&local_30->OpenPopupStack,(local_30->BeginPopupStack).Size);
          uVar12 = uVar11;
        }
        else {
          in_stack_fffffffffffffe10 = (ImGuiWindow *)0x0;
          uVar12 = uVar11;
        }
        if (((in_stack_fffffffffffffe10 == (ImGuiWindow *)0x0) ||
            (*(ImGuiWindow **)&in_stack_fffffffffffffe10->ID == (ImGuiWindow *)0x0)) ||
           ((*(ImGuiWindow **)&in_stack_fffffffffffffe10->ID)->ParentWindow != local_28)) {
          pIVar6 = (ImGuiWindow *)0x0;
        }
        else {
          pIVar6 = *(ImGuiWindow **)&in_stack_fffffffffffffe10->ID;
        }
        if ((local_30->HoveredWindow == local_28) && (pIVar6 != (ImGuiWindow *)0x0)) {
          fVar3 = local_30->FontSize;
          fVar2 = *(float *)(&DAT_00569b68 + (ulong)((local_28->Pos).x < (pIVar6->Pos).x) * 4);
          join_0x00001240_0x00001200_ = ImGuiWindow::Rect((ImGuiWindow *)0x508440);
          local_138[0] = ::operator-(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x508470);
          if (fVar2 <= 0.0) {
            local_140 = ImRect::GetTR(in_stack_fffffffffffffdf8);
          }
          else {
            local_140 = ImRect::GetTL((ImRect *)(local_138 + 1));
          }
          if (fVar2 <= 0.0) {
            local_148 = ImRect::GetBR((ImRect *)(local_138 + 1));
          }
          else {
            local_148 = ImRect::GetBL(in_stack_fffffffffffffdf8);
          }
          local_14c = ImClamp<float>(ABS(local_138[0].x - local_140.x) * 0.3,fVar3 * 0.5,fVar3 * 2.5
                                    );
          local_138[0].x = fVar2 * -0.5 + local_138[0].x;
          local_140.x = fVar2 * fVar3 + local_140.x;
          fVar5 = local_138[0].y;
          local_148.x = fVar2 * fVar3 + local_148.x;
          fVar2 = ImMax<float>((local_140.y - local_14c) - local_138[0].y,-fVar3 * 8.0);
          local_140.y = fVar5 + fVar2;
          fVar2 = local_138[0].y;
          fVar3 = ImMin<float>((local_148.y + local_14c) - local_138[0].y,fVar3 * 8.0);
          local_148.y = fVar2 + fVar3;
          bVar1 = ImTriangleContainsPoint(local_138,&local_140,&local_148,&(local_30->IO).MousePos);
          uVar12 = CONCAT31((int3)(uVar12 >> 8),bVar1);
        }
        popup_flags = (ImGuiPopupFlags)((ulong)pIVar6 >> 0x20);
        if ((((local_3d & 1) != 0) && ((uVar12 & 0x1000000) == 0)) &&
           ((local_30->HoveredWindow == local_28 &&
            (((uVar12 & 1) == 0 && ((local_30->NavDisableMouseHover & 1U) == 0)))))) {
          uVar12 = CONCAT22((short)(uVar12 >> 0x10),CONCAT11(1,(char)uVar12));
        }
        if (((local_3d & 1) == 0) && ((local_69 & 1U) != 0)) {
          uVar12 = (uint)CONCAT12(1,(short)uVar12);
        }
        else if (((local_3d & 1) == 0) && (((uVar12 & 0x1000000) != 0 && ((uVar12 & 1) == 0)))) {
          uVar12 = (uint)CONCAT12(1,(short)uVar12);
        }
        if (((float)local_30->NavId == local_3c) && (local_30->NavMoveDir == 1)) {
          uVar12 = (uint)CONCAT12(1,(short)uVar12);
          NavMoveRequestCancel();
        }
      }
      else if ((((local_3d & 1) == 0) || ((local_69 & 1U) == 0)) || ((local_4d & 1U) == 0)) {
        if (((local_69 & 1U) == 0) &&
           ((((uVar10 & 0x1000000) == 0 || ((local_4d & 1U) == 0)) || ((local_3d & 1) != 0)))) {
          if (((float)local_30->NavId == local_3c) && (local_30->NavMoveDir == 3)) {
            uVar12 = CONCAT13(bVar7,0x10000);
            NavMoveRequestCancel();
          }
        }
        else {
          uVar12 = CONCAT13(bVar7,0x10000);
        }
      }
      else {
        local_3d = 0;
        uVar12 = CONCAT13(bVar7,0x100);
      }
      if ((local_19 & 1) == 0) {
        uVar12 = CONCAT22((short)(uVar12 >> 0x10),0x100);
      }
      if (((uVar12 & 0x100) != 0) &&
         (bVar1 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffe10,popup_flags), bVar1)) {
        ClosePopupToLevel((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                          SUB81((ulong)in_stack_fffffffffffffe20 >> 0x18,0));
      }
      PopID();
      if ((((uVar12 & 0x10000) == 0) || ((local_3d & 1) != 0)) ||
         ((local_30->OpenPopupStack).Size <= (local_30->BeginPopupStack).Size)) {
        if ((uVar12 & 0x10000) != 0) {
          local_3d = 1;
          OpenPopup((char *)in_stack_fffffffffffffe10,popup_flags);
        }
        count = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
      }
      else {
        OpenPopup((char *)in_stack_fffffffffffffe10,popup_flags);
        count = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
      }
      if ((local_3d & 1) == 0) {
        ImGuiNextWindowData::ClearFlags(&local_30->NextWindowData);
      }
      else {
        memcpy(local_188,&local_30->LastItemData,0x3c);
        ImVec2::ImVec2(&local_190,0.0,0.0);
        SetNextWindowPos(&local_58,1,&local_190);
        PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                     SUB84(in_stack_fffffffffffffe20,0));
        local_3d = BeginPopupEx(id_00,flags);
        PopStyleVar(count);
        if (((local_3d & 1) != 0) &&
           (memcpy(&local_30->LastItemData,local_188,0x3c), local_30->HoveredWindow == local_28)) {
          (local_30->LastItemData).StatusFlags = (local_30->LastItemData).StatusFlags | 0x80;
        }
      }
      local_1 = (bool)(local_3d & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginMenuEx(const char* label, const char* icon, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    // The first menu in a hierarchy isn't so hovering doesn't get across (otherwise e.g. resizing borders with ImGuiButtonFlags_FlattenChildren would react), but top-most BeginMenu() will bypass that limitation.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        window_flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. ImGuiStorage mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, window_flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent without always being a Child window)
    // This is only done for items for the menu set and not the full parent window.
    const bool menuset_is_open = IsRootOfOpenMenuSet();
    if (menuset_is_open)
        PushItemFlag(ImGuiItemFlags_NoWindowHoverableCheck, true);

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    PushID(label);
    if (!enabled)
        BeginDisabled();
    const ImGuiMenuColumns* offsets = &window->DC.MenuColumns;
    bool pressed;

    // We use ImGuiSelectableFlags_NoSetKeyOwner to allow down on one menu item, move, up on another.
    const ImGuiSelectableFlags selectable_flags = ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_NoSetKeyOwner | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, selectable_flags, ImVec2(w, 0.0f));
        RenderText(text_pos, label);
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a regular/vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float icon_w = (icon && icon[0]) ? CalcTextSize(icon, NULL).x : 0.0f;
        float checkmark_w = IM_FLOOR(g.FontSize * 1.20f);
        float min_w = window->DC.MenuColumns.DeclColumns(icon_w, label_size.x, 0.0f, checkmark_w); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, selectable_flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        RenderText(text_pos, label);
        if (icon_w > 0.0f)
            RenderText(pos + ImVec2(offsets->OffsetIcon, 0.0f), icon);
        RenderArrow(window->DrawList, pos + ImVec2(offsets->OffsetMark + extra_w + g.FontSize * 0.30f, 0.0f), GetColorU32(ImGuiCol_Text), ImGuiDir_Right);
    }
    if (!enabled)
        EndDisabled();

    const bool hovered = (g.HoveredId == id) && enabled && !g.NavDisableMouseHover;
    if (menuset_is_open)
        PopItemFlag();

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_child_menu = false;
        ImGuiPopupData* child_popup = (g.BeginPopupStack.Size < g.OpenPopupStack.Size) ? &g.OpenPopupStack[g.BeginPopupStack.Size] : NULL; // Popup candidate (testing below)
        ImGuiWindow* child_menu_window = (child_popup && child_popup->Window && child_popup->Window->ParentWindow == window) ? child_popup->Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL)
        {
            float ref_unit = g.FontSize; // FIXME-DPI
            float child_dir = (window->Pos.x < child_menu_window->Pos.x) ? 1.0f : -1.0f;
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = (g.IO.MousePos - g.IO.MouseDelta);
            ImVec2 tb = (child_dir > 0.0f) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (child_dir > 0.0f) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, ref_unit * 0.5f, ref_unit * 2.5f);   // add a bit of extra slack.
            ta.x += child_dir * -0.5f;
            tb.x += child_dir * ref_unit;
            tc.x += child_dir * ref_unit;
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -ref_unit * 8.0f);                           // triangle has maximum height to limit the slope and the bias toward large sub-menus
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +ref_unit * 8.0f);
            moving_toward_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_toward_child_menu ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }

        // The 'HovereWindow == window' check creates an inconsistency (e.g. moving away from menu slowly tends to hit same window, whereas moving away fast does not)
        // But we also need to not close the top-menu menu when moving over void. Perhaps we should extend the triangle check to a larger polygon.
        // (Remember to test this on BeginPopup("A")->BeginMenu("B") sequence which behaves slightly differently as B isn't a Child of A and hovering isn't shared.)
        if (menu_is_open && !hovered && g.HoveredWindow == window && !moving_toward_child_menu && !g.NavDisableMouseHover)
            want_close = true;

        // Open
        if (!menu_is_open && pressed) // Click/activate to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_child_menu) // Hover to open
            want_open = true;
        if (g.NavId == id && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id, ImGuiPopupFlags_None))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));
    PopID();

    if (want_open && !menu_is_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't reopen/recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
    }
    else if (want_open)
    {
        menu_is_open = true;
        OpenPopup(label);
    }

    if (menu_is_open)
    {
        ImGuiLastItemData last_item_in_parent = g.LastItemData;
        SetNextWindowPos(popup_pos, ImGuiCond_Always);                  // Note: misleading: the value will serve as reference for FindBestWindowPosForPopup(), not actual pos.
        PushStyleVar(ImGuiStyleVar_ChildRounding, style.PopupRounding); // First level will use _PopupRounding, subsequent will use _ChildRounding
        menu_is_open = BeginPopupEx(id, window_flags);                  // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        PopStyleVar();
        if (menu_is_open)
        {
            // Restore LastItemData so IsItemXXXX functions can work after BeginMenu()/EndMenu()
            // (This fixes using IsItemClicked() and IsItemHovered(), but IsItemHovered() also relies on its support for ImGuiItemFlags_NoWindowHoverableCheck)
            g.LastItemData = last_item_in_parent;
            if (g.HoveredWindow == window)
                g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;
        }
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}